

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_modifiers.cpp
# Opt level: O0

bool __thiscall
icu_63::number::impl::SimpleModifier::semanticallyEquivalent(SimpleModifier *this,Modifier *other)

{
  UBool UVar1;
  bool local_41;
  long local_40;
  SimpleModifier *_other;
  Modifier *other_local;
  SimpleModifier *this_local;
  
  if (other == (Modifier *)0x0) {
    local_40 = 0;
  }
  else {
    local_40 = __dynamic_cast(other,&Modifier::typeinfo,&typeinfo,0);
  }
  if (local_40 == 0) {
    this_local._7_1_ = false;
  }
  else if ((this->fParameters).obj == (ModifierStore *)0x0) {
    UVar1 = UnicodeString::operator==(&this->fCompiledPattern,(UnicodeString *)(local_40 + 8));
    local_41 = false;
    if ((UVar1 != '\0') && (local_41 = false, this->fField == *(Field *)(local_40 + 0x48))) {
      local_41 = (this->fStrong & 1U) == (*(byte *)(local_40 + 0x4c) & 1);
    }
    this_local._7_1_ = local_41;
  }
  else {
    this_local._7_1_ = (this->fParameters).obj == *(ModifierStore **)(local_40 + 0x60);
  }
  return this_local._7_1_;
}

Assistant:

bool SimpleModifier::semanticallyEquivalent(const Modifier& other) const {
    auto* _other = dynamic_cast<const SimpleModifier*>(&other);
    if (_other == nullptr) {
        return false;
    }
    if (fParameters.obj != nullptr) {
        return fParameters.obj == _other->fParameters.obj;
    }
    return fCompiledPattern == _other->fCompiledPattern
        && fField == _other->fField
        && fStrong == _other->fStrong;
}